

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

int __thiscall Fl_Tree_Item::remove_child(Fl_Tree_Item *this,Fl_Tree_Item *item)

{
  int iVar1;
  Fl_Tree_Item *pFVar2;
  uint local_24;
  int t;
  Fl_Tree_Item *item_local;
  Fl_Tree_Item *this_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = children(this);
    if (iVar1 <= (int)local_24) {
      return -1;
    }
    pFVar2 = child(this,local_24);
    if (pFVar2 == item) break;
    local_24 = local_24 + 1;
  }
  clear_children(item);
  Fl_Tree_Item_Array::remove(&this->_children,(char *)(ulong)local_24);
  recalc_tree(this);
  return 0;
}

Assistant:

int Fl_Tree_Item::remove_child(Fl_Tree_Item *item) {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t) == item ) {
      item->clear_children();
      _children.remove(t);
      recalc_tree();		// may change tree geometry
      return(0);
    }
  }
  return(-1);
}